

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printTestFilters(ConsoleReporter *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar2;
  Colour guard;
  char local_31;
  string local_30;
  
  iVar1 = (*((this->super_StreamingReporterBase).m_config)->_vptr_IConfig[0xd])();
  if (*(long *)CONCAT44(extraout_var,iVar1) != ((long *)CONCAT44(extraout_var,iVar1))[1]) {
    Colour::use(BrightYellow);
    poVar2 = (this->super_StreamingReporterBase).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Filters: ",9);
    iVar1 = (*((this->super_StreamingReporterBase).m_config)->_vptr_IConfig[0xf])();
    serializeFilters(&local_30,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(extraout_var_00,iVar1));
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_30._M_dataplus._M_p,local_30._M_string_length);
    local_31 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_31,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    Colour::use(None);
  }
  return;
}

Assistant:

void ConsoleReporter::printTestFilters() {
                if (m_config->testSpec().hasFilters()) {
                    Colour guard(Colour::BrightYellow);
                    stream << "Filters: " << serializeFilters(m_config->getTestsOrTags()) << '\n';
                }
            }